

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O2

VariableIndex __thiscall
dynet::ComputationGraph::
add_function<dynet::PickNegLogSoftmax,std::vector<unsigned_int,std::allocator<unsigned_int>>const*&>
          (ComputationGraph *this,initializer_list<dynet::VariableIndex> *arguments,
          vector<unsigned_int,_std::allocator<unsigned_int>_> **side_information)

{
  PickNegLogSoftmax *this_00;
  undefined8 *in_RCX;
  PickNegLogSoftmax *local_30;
  
  *(int *)&(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)(arguments->_M_len - (long)arguments->_M_array >> 3);
  this_00 = (PickNegLogSoftmax *)operator_new(0x88);
  PickNegLogSoftmax::PickNegLogSoftmax
            (this_00,(initializer_list<dynet::VariableIndex> *)side_information,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)*in_RCX);
  local_30 = this_00;
  std::vector<dynet::Node*,std::allocator<dynet::Node*>>::emplace_back<dynet::Node*>
            ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)arguments,(Node **)&local_30);
  set_dim_for_new_node((ComputationGraph *)arguments,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
                                              Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}